

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

bool __thiscall position::gives_check(position *this,Move *m)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  U64 UVar6;
  int iVar7;
  bool local_61;
  bool local_56;
  Square local_54;
  Piece PStack_50;
  bool checks;
  Square target;
  Square local_48;
  Piece capPiece;
  uint local_40;
  Piece piece;
  Piece promotePiece;
  Square capSq;
  U8 to;
  U8 from;
  Color CStack_30;
  bool isCastles;
  bool isQuiet;
  bool isEp;
  bool isPromotion;
  bool isCapture;
  Color them;
  Color c;
  unsigned_long_long mask;
  Move *m_local;
  position *this_local;
  
  _them = 0;
  mask = (unsigned_long_long)m;
  m_local = (Move *)this;
  _isQuiet = to_move(this);
  CStack_30 = _isQuiet ^ black;
  local_56 = true;
  if ((((*(char *)(mask + 2) != '\v') && (local_56 = true, *(char *)(mask + 2) != '\x10')) &&
      (local_56 = true, *(char *)(mask + 2) != '\x06')) &&
     ((local_56 = true, *(char *)(mask + 2) != '\a' &&
      (local_56 = true, *(char *)(mask + 2) != '\x04')))) {
    local_56 = *(char *)(mask + 2) == '\x05';
  }
  capSq._3_1_ = local_56;
  capSq._2_1_ = is_promotion(this,(U8 *)(mask + 2));
  capSq._1_1_ = *(char *)(mask + 2) == '\f';
  capSq._0_1_ = *(char *)(mask + 2) == '\n';
  local_61 = true;
  if ((*(char *)(mask + 2) != '\r') && (local_61 = true, *(char *)(mask + 2) != '\b')) {
    local_61 = *(char *)(mask + 2) == '\t';
  }
  promotePiece._3_1_ = local_61;
  promotePiece._2_1_ = *(undefined1 *)mask;
  promotePiece._1_1_ = *(undefined1 *)(mask + 1);
  piece = 0x41;
  local_40 = 7;
  local_48 = (Square)(byte)promotePiece._2_1_;
  capPiece = piece_on(this,&local_48);
  target = H1;
  if ((capPiece == king) && ((promotePiece._3_1_ & 1) == pawn >> 0x18)) {
    this_local._7_1_ = false;
  }
  else {
    if ((promotePiece._3_1_ & 1) == pawn >> 0x18) {
      uVar1 = (&bitboards::squares)[(byte)promotePiece._2_1_];
      uVar2 = (&bitboards::squares)[(byte)promotePiece._1_1_];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)_isQuiet);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)capPiece);
      *pvVar5 = (uVar1 | uVar2) ^ *pvVar5;
      if ((capSq._2_1_ & 1) != A1 >> 0x10) {
        uVar1 = (&bitboards::squares)[(byte)promotePiece._1_1_];
        pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                           (&(this->pcs).bitmap,(ulong)_isQuiet);
        pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)capPiece);
        *pvVar5 = uVar1 ^ *pvVar5;
      }
    }
    else {
      if (_isQuiet == white) {
        promotePiece._1_1_ = 3;
        if (*(char *)(mask + 2) == '\b') {
          promotePiece._1_1_ = 5;
        }
        promotePiece._2_1_ = pawn >> 0x10;
        if (*(char *)(mask + 2) == '\b') {
          promotePiece._2_1_ = 7;
        }
      }
      else if (_isQuiet == black) {
        promotePiece._1_1_ = 0x3b;
        if (*(char *)(mask + 2) == '\b') {
          promotePiece._1_1_ = 0x3d;
        }
        promotePiece._2_1_ = 0x38;
        if (*(char *)(mask + 2) == '\b') {
          promotePiece._2_1_ = 0x3f;
        }
      }
      uVar1 = (&bitboards::squares)[(byte)promotePiece._2_1_];
      uVar2 = (&bitboards::squares)[(byte)promotePiece._1_1_];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)_isQuiet);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,3);
      *pvVar5 = (uVar1 | uVar2) ^ *pvVar5;
    }
    if (((capSq._3_1_ & 1) != A1 >> 0x18) || ((capSq._1_1_ & 1) != A1 >> 8)) {
      if ((capSq._1_1_ & 1) == A1 >> 8) {
        piece = (Piece)(byte)promotePiece._1_1_;
      }
      else {
        iVar7 = 8;
        if (_isQuiet == white) {
          iVar7 = -8;
        }
        piece = (uint)(byte)promotePiece._1_1_ + iVar7;
      }
      PStack_50 = piece;
      target = piece_on(this,&stack0xffffffffffffffb0);
      uVar1 = (&bitboards::squares)[piece];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)CStack_30);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)target);
      *pvVar5 = uVar1 ^ *pvVar5;
      _them = (&bitboards::squares)[piece] ^ _them;
    }
    if ((capSq._2_1_ & 1) != A1 >> 0x10) {
      if ((*(char *)(mask + 2) == '\a') || (*(char *)(mask + 2) == '\x03')) {
        local_40 = 1;
      }
      if ((*(char *)(mask + 2) == '\x06') || (*(char *)(mask + 2) == '\x02')) {
        local_40 = 2;
      }
      if ((*(char *)(mask + 2) == '\x05') || (*(char *)(mask + 2) == '\x01')) {
        local_40 = 3;
      }
      if ((*(char *)(mask + 2) == '\x04') || (*(char *)(mask + 2) == '\0')) {
        local_40 = 4;
      }
      uVar1 = (&bitboards::squares)[(byte)promotePiece._1_1_];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)_isQuiet);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)local_40);
      *pvVar5 = uVar1 | *pvVar5;
    }
    UVar6 = all_pieces(this);
    _them = UVar6 ^ (&bitboards::squares)[(byte)promotePiece._2_1_] |
            (&bitboards::squares)[(byte)promotePiece._1_1_];
    local_54 = king_square(this,&stack0xffffffffffffffd0);
    bVar3 = is_attacked(this,&local_54,&stack0xffffffffffffffd0,(Color *)&isQuiet,_them);
    this_local._7_1_ = bVar3;
    if ((promotePiece._3_1_ & 1) == pawn >> 0x18) {
      uVar1 = (&bitboards::squares)[(byte)promotePiece._1_1_];
      uVar2 = (&bitboards::squares)[(byte)promotePiece._2_1_];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)_isQuiet);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)capPiece);
      *pvVar5 = (uVar1 | uVar2) ^ *pvVar5;
      if (((capSq._3_1_ & 1) != A1 >> 0x18) || ((capSq._1_1_ & 1) != A1 >> 8)) {
        uVar1 = (&bitboards::squares)[piece];
        pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                           (&(this->pcs).bitmap,(ulong)CStack_30);
        pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)target);
        *pvVar5 = uVar1 | *pvVar5;
      }
      if ((capSq._2_1_ & 1) != A1 >> 0x10) {
        uVar1 = (&bitboards::squares)[(byte)promotePiece._1_1_];
        pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                           (&(this->pcs).bitmap,(ulong)_isQuiet);
        pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,(ulong)local_40);
        *pvVar5 = uVar1 ^ *pvVar5;
      }
    }
    else {
      uVar1 = (&bitboards::squares)[(byte)promotePiece._1_1_];
      uVar2 = (&bitboards::squares)[(byte)promotePiece._2_1_];
      pvVar4 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[]
                         (&(this->pcs).bitmap,(ulong)_isQuiet);
      pvVar5 = std::array<unsigned_long,_64UL>::operator[](pvVar4,3);
      *pvVar5 = (uVar1 | uVar2) ^ *pvVar5;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool position::gives_check(const Move& m) {
	// Note: assumes the input move is legal (!)
	auto mask = 0ULL;
	auto c = to_move();
	auto them = Color(c ^ 1);
	auto isCapture = m.type == Movetype::capture ||
		m.type == Movetype::capture_promotion ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n ||
		m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r;
	auto isPromotion = is_promotion(m.type);
	auto isEp = m.type == Movetype::ep;
	auto isQuiet = m.type == Movetype::quiet;
	auto isCastles = m.type == Movetype::castles ||
		m.type == Movetype::castle_ks ||
		m.type == Movetype::castle_qs;
	auto from = m.f;
	auto to = m.t;
	auto capSq = Square::no_square;
	auto promotePiece = Piece::no_piece;
	auto piece = piece_on(Square(from));
	auto capPiece = Piece::no_piece;
	if (piece == king && !isCastles)
		return false;

	// Move our piece
	if (isCastles) {
		if (c == white) {
			to = (m.type == Movetype::castle_ks ? F1 : D1);
			from = (m.type == Movetype::castle_ks ? H1 : A1);
		}
		else if (c == black) {
			to = (m.type == Movetype::castle_ks ? F8 : D8);
			from = (m.type == Movetype::castle_ks ? H8 : A8);
		}
		pcs.bitmap[c][rook] ^= (bitboards::squares[from] | bitboards::squares[to]);
	}
	else {
		pcs.bitmap[c][piece] ^= (bitboards::squares[from] | bitboards::squares[to]);
		if (isPromotion)
			pcs.bitmap[c][piece] ^= bitboards::squares[to];
	}

	// Remove the captured piece
	if (isCapture || isEp) {
		if (isEp)
			capSq = Square(to + (c == white ? -8 : 8));
		else
			capSq = Square(to);

		capPiece = piece_on(Square(capSq));
		pcs.bitmap[them][capPiece] ^= bitboards::squares[capSq];
		mask ^= bitboards::squares[capSq];
	}

	// Add promotion piece
	if (isPromotion) {
		if (m.type == Movetype::capture_promotion_n || m.type == Movetype::promotion_n)
			promotePiece = knight;
		if (m.type == Movetype::capture_promotion_b || m.type == Movetype::promotion_b)
			promotePiece = bishop;
		if (m.type == Movetype::capture_promotion_r || m.type == Movetype::promotion_r)
			promotePiece = rook;
		if (m.type == Movetype::capture_promotion_q || m.type == Movetype::promotion_q)
			promotePiece = queen;
		pcs.bitmap[c][promotePiece] |= bitboards::squares[to];
	}

	// Make the check mask
	mask = (all_pieces() ^ bitboards::squares[from]) | bitboards::squares[to];

	auto target = king_square(them);
	auto checks = is_attacked(target, them, c, mask);

	// Reset the pcs bitmap
	if (isCastles) {
		pcs.bitmap[c][rook] ^= (bitboards::squares[to] | bitboards::squares[from]);
	}
	else {
		// Move our piece back
		pcs.bitmap[c][piece] ^= (bitboards::squares[to] | bitboards::squares[from]);

		// Place back the captured piece and remove promotion piece
		if (isCapture || isEp)
			pcs.bitmap[them][capPiece] |= bitboards::squares[capSq];
		if (isPromotion) {
			pcs.bitmap[c][promotePiece] ^= bitboards::squares[to];
		}
	}

	return checks;
}